

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_tree.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  uint local_114;
  bool local_10d;
  int model;
  anon_class_8_1_ba9a1774 redoAll;
  UndoHistory history;
  Cmd cmd8;
  Cmd cmd7;
  Cmd cmd6;
  Cmd cmd5;
  Cmd cmd4;
  Cmd cmd3;
  Cmd cmd2;
  Cmd cmd1;
  
  cmd8.m_model = &model;
  model = 0;
  cmd1.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00105d38;
  cmd1.m_redo_value = 1;
  cmd1.m_undo_value = 0;
  cmd2.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00105d38;
  cmd2.m_redo_value = 2;
  cmd2.m_undo_value = 1;
  cmd3.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00105d38;
  cmd3.m_redo_value = 3;
  cmd3.m_undo_value = 2;
  cmd4.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00105d38;
  cmd4.m_redo_value = 4;
  cmd4.m_undo_value = 3;
  cmd5.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00105d38;
  cmd5.m_redo_value = 5;
  cmd5.m_undo_value = 2;
  cmd6.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00105d38;
  cmd6.m_redo_value = 6;
  cmd6.m_undo_value = 5;
  cmd7.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00105d38;
  cmd7.m_redo_value = 7;
  cmd7.m_undo_value = 5;
  cmd8.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00105d38;
  cmd8.m_redo_value = 8;
  cmd8.m_undo_value = 7;
  cmd7.m_model = cmd8.m_model;
  cmd6.m_model = cmd8.m_model;
  cmd5.m_model = cmd8.m_model;
  cmd4.m_model = cmd8.m_model;
  cmd3.m_model = cmd8.m_model;
  cmd2.m_model = cmd8.m_model;
  cmd1.m_model = cmd8.m_model;
  undo::UndoHistory::UndoHistory(&history,(UndoHistoryDelegate *)0x0);
  model = 1;
  undo::UndoHistory::add(&history,&cmd1.super_UndoCommand);
  model = 2;
  undo::UndoHistory::add(&history,&cmd2.super_UndoCommand);
  *cmd3.m_model = cmd3.m_redo_value;
  undo::UndoHistory::add(&history,&cmd3.super_UndoCommand);
  *cmd4.m_model = cmd4.m_redo_value;
  undo::UndoHistory::add(&history,&cmd4.super_UndoCommand);
  undo::UndoHistory::undo(&history);
  undo::UndoHistory::undo(&history);
  *cmd5.m_model = cmd5.m_redo_value;
  undo::UndoHistory::add(&history,&cmd5.super_UndoCommand);
  *cmd6.m_model = cmd6.m_redo_value;
  undo::UndoHistory::add(&history,&cmd6.super_UndoCommand);
  undo::UndoHistory::undo(&history);
  *cmd7.m_model = cmd7.m_redo_value;
  undo::UndoHistory::add(&history,&cmd7.super_UndoCommand);
  *cmd8.m_model = cmd8.m_redo_value;
  undo::UndoHistory::add(&history,&cmd8.super_UndoCommand);
  redoAll.history._0_4_ = 8;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2a);
  undo::UndoHistory::undo(&history);
  redoAll.history._0_4_ = 7;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2b);
  undo::UndoHistory::undo(&history);
  redoAll.history._0_4_ = 6;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2c);
  undo::UndoHistory::undo(&history);
  redoAll.history._0_4_ = 5;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2d);
  undo::UndoHistory::undo(&history);
  redoAll.history._0_4_ = 4;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2e);
  undo::UndoHistory::undo(&history);
  redoAll.history._0_4_ = 3;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2f);
  undo::UndoHistory::undo(&history);
  redoAll.history._0_4_ = 2;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x30);
  undo::UndoHistory::undo(&history);
  redoAll.history._0_4_ = 1;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x31);
  undo::UndoHistory::undo(&history);
  redoAll.history = redoAll.history & 0xffffffff00000000;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x32);
  redoAll.history = redoAll.history & 0xffffffffffffff00;
  bVar1 = undo::UndoHistory::canUndo(&history);
  local_114._0_1_ = bVar1;
  expect_eq<bool,bool>
            ((bool *)&redoAll,(bool *)&local_114,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x33);
  undo::UndoHistory::redo(&history);
  redoAll.history._0_4_ = 1;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x35);
  undo::UndoHistory::redo(&history);
  redoAll.history._0_4_ = 2;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x36);
  undo::UndoHistory::redo(&history);
  redoAll.history._0_4_ = 3;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x37);
  undo::UndoHistory::redo(&history);
  redoAll.history._0_4_ = 4;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x38);
  undo::UndoHistory::redo(&history);
  redoAll.history._0_4_ = 5;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x39);
  undo::UndoHistory::redo(&history);
  redoAll.history._0_4_ = 6;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x3a);
  undo::UndoHistory::redo(&history);
  redoAll.history._0_4_ = 7;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x3b);
  undo::UndoHistory::redo(&history);
  redoAll.history._0_4_ = 8;
  expect_eq<int,int>((int *)&redoAll,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x3c);
  redoAll.history = redoAll.history & 0xffffffffffffff00;
  bVar1 = undo::UndoHistory::canRedo(&history);
  local_114 = CONCAT31(local_114._1_3_,bVar1);
  expect_eq<bool,bool>
            ((bool *)&redoAll,(bool *)&local_114,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x3d);
  redoAll.history = &history;
  while( true ) {
    bVar1 = undo::UndoHistory::canUndo(&history);
    if (!bVar1) break;
    undo::UndoHistory::undo(&history);
  }
  local_114 = 0;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x4e);
  undo::UndoHistory::redo(&history);
  local_114 = 1;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x4f);
  local_114 = local_114 & 0xffffff00;
  local_10d = undo::UndoHistory::deleteFirstState(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x50);
  main::anon_class_8_1_ba9a1774::operator()(&redoAll);
  local_114 = 8;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x51);
  local_114 = CONCAT31(local_114._1_3_,1);
  local_10d = undo::UndoHistory::deleteFirstState(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x57);
  local_114 = 8;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x59);
  undo::UndoHistory::undo(&history);
  local_114 = 7;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5a);
  undo::UndoHistory::undo(&history);
  local_114 = 6;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5b);
  undo::UndoHistory::undo(&history);
  local_114 = 5;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5c);
  undo::UndoHistory::undo(&history);
  local_114 = 4;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5d);
  undo::UndoHistory::undo(&history);
  local_114 = 3;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5e);
  undo::UndoHistory::undo(&history);
  local_114 = 2;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5f);
  undo::UndoHistory::undo(&history);
  local_114 = 1;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x60);
  local_114 = local_114 & 0xffffff00;
  local_10d = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x61);
  main::anon_class_8_1_ba9a1774::operator()(&redoAll);
  local_114 = 8;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x62);
  local_114 = CONCAT31(local_114._1_3_,1);
  local_10d = undo::UndoHistory::deleteFirstState(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x68);
  local_114 = 8;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6a);
  undo::UndoHistory::undo(&history);
  local_114 = 7;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6b);
  undo::UndoHistory::undo(&history);
  local_114 = 6;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6c);
  undo::UndoHistory::undo(&history);
  local_114 = 5;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6d);
  undo::UndoHistory::undo(&history);
  local_114 = 2;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6e);
  local_114 = local_114 & 0xffffff00;
  local_10d = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x6f);
  main::anon_class_8_1_ba9a1774::operator()(&redoAll);
  local_114 = 8;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x70);
  local_114 = CONCAT31(local_114._1_3_,1);
  local_10d = undo::UndoHistory::deleteFirstState(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x76);
  local_114 = 8;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x78);
  undo::UndoHistory::undo(&history);
  local_114 = 7;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x79);
  undo::UndoHistory::undo(&history);
  local_114 = 5;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x7a);
  local_114 = local_114 & 0xffffff00;
  local_10d = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x7b);
  main::anon_class_8_1_ba9a1774::operator()(&redoAll);
  local_114 = 8;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x7c);
  local_114 = CONCAT31(local_114._1_3_,1);
  local_10d = undo::UndoHistory::deleteFirstState(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x82);
  local_114 = 8;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x84);
  undo::UndoHistory::undo(&history);
  local_114 = 7;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x85);
  local_114 = local_114 & 0xffffff00;
  local_10d = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x86);
  undo::UndoHistory::redo(&history);
  local_114 = 8;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x87);
  local_114 = local_114 & 0xffffff00;
  local_10d = undo::UndoHistory::deleteFirstState(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x8d);
  local_114 = 8;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x8e);
  undo::UndoHistory::undo(&history);
  local_114 = 7;
  expect_eq<int,int>((int *)&local_114,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x8f);
  local_114._0_1_ = true;
  local_10d = undo::UndoHistory::deleteFirstState(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x91);
  local_114._0_1_ = false;
  local_10d = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x92);
  local_114 = (uint)local_114._1_3_ << 8;
  local_10d = undo::UndoHistory::canRedo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_114,&local_10d,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x93);
  undo::UndoHistory::~UndoHistory(&history);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  // 1 --- 2 --- 3 --- 4   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  int model = 0;
  Cmd cmd1(model, 1, 0);
  Cmd cmd2(model, 2, 1);
  Cmd cmd3(model, 3, 2);
  Cmd cmd4(model, 4, 3);
  Cmd cmd5(model, 5, 2);
  Cmd cmd6(model, 6, 5);
  Cmd cmd7(model, 7, 5);
  Cmd cmd8(model, 8, 7);

  UndoHistory history;
  cmd1.redo(); history.add(&cmd1);
  cmd2.redo(); history.add(&cmd2);
  cmd3.redo(); history.add(&cmd3);
  cmd4.redo(); history.add(&cmd4);
  history.undo();
  history.undo();
  cmd5.redo(); history.add(&cmd5);
  cmd6.redo(); history.add(&cmd6);
  history.undo();
  cmd7.redo(); history.add(&cmd7);
  cmd8.redo(); history.add(&cmd8);

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(6, model);
  history.undo(); EXPECT_EQ(5, model);
  history.undo(); EXPECT_EQ(4, model);
  history.undo(); EXPECT_EQ(3, model);
  history.undo(); EXPECT_EQ(2, model);
  history.undo(); EXPECT_EQ(1, model);
  history.undo(); EXPECT_EQ(0, model);
  EXPECT_FALSE(history.canUndo());

  history.redo(); EXPECT_EQ(1, model);
  history.redo(); EXPECT_EQ(2, model);
  history.redo(); EXPECT_EQ(3, model);
  history.redo(); EXPECT_EQ(4,  model);
  history.redo(); EXPECT_EQ(5,  model);
  history.redo(); EXPECT_EQ(6,  model);
  history.redo(); EXPECT_EQ(7,  model);
  history.redo(); EXPECT_EQ(8,  model);
  EXPECT_FALSE(history.canRedo());

  // Delete states ----------------------------------------

  auto undoAll = [&]{
    while (history.canUndo())
      history.undo();
  };
  auto redoAll = [&]{
    while (history.canRedo())
      history.redo();
  };

  // Cannot delete state 1 if we are in that state
  // 1 --- 2 --- 3 --- 4   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  undoAll(); EXPECT_EQ(0, model);
  history.redo(); EXPECT_EQ(1, model);
  EXPECT_FALSE(history.deleteFirstState());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 1
  // x --- 2 --- 3 --- 4   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(6, model);
  history.undo(); EXPECT_EQ(5, model);
  history.undo(); EXPECT_EQ(4, model);
  history.undo(); EXPECT_EQ(3, model);
  history.undo(); EXPECT_EQ(2, model);
  history.undo(); EXPECT_EQ(1, model);
  EXPECT_FALSE(history.canUndo());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 2 (we cannot go back to 3 or 4 from 5 because 2 is gone)
  // x --- x --- x --- x   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(6, model);
  history.undo(); EXPECT_EQ(5, model);
  history.undo(); EXPECT_EQ(2, model);
  EXPECT_FALSE(history.canUndo());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 5 (we cannot go back to 6 from 7 because 5 is gone)
  // x --- x --- x --- x   -------- 7 --- 8
  //       |              |
  //        ------------- x --- x
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(5, model);
  EXPECT_FALSE(history.canUndo());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 7
  // x --- x --- x --- x   -------- x --- 8
  //       |              |
  //        ------------- x --- x
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  EXPECT_FALSE(history.canUndo());
  history.redo(); EXPECT_EQ(8, model);

  // Cannot delete state 8 because is the current state
  // x --- x --- x --- x   -------- x --- 8
  //       |              |
  //        ------------- x --- x
  EXPECT_FALSE(history.deleteFirstState());
  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  // Now we can delete the whole history
  EXPECT_TRUE(history.deleteFirstState());
  EXPECT_FALSE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
}